

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O1

void __thiscall TxRequestTracker::Impl::DisconnectedPeer(Impl *this,NodeId peer)

{
  long *plVar1;
  _Head_base<2UL,_const_uint256_&,_false> _Var2;
  key_type_conflict *__key;
  bool bVar3;
  iterator it;
  _Head_base<2UL,_const_uint256_&,_false> _Var4;
  iterator __position;
  undefined1 *puVar5;
  incrementable_type nrv;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar6;
  long in_FS_OFFSET;
  tuple<long,_bool,_const_uint256_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
  super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
  super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl =
       (_Head_base<2UL,_const_uint256_&,_false>)&uint256::ZERO;
  local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
  super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Head_base<1UL,_bool,_false>._M_head_impl =
       false;
  local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.super__Head_base<0UL,_long,_false>.
  _M_head_impl = peer;
  it = boost::multi_index::detail::
       ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
       ::lower_bound<std::tuple<long,bool,uint256_const&>>
                 ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                   *)&(this->m_index).super_type,&local_50);
  if (it.node !=
      (this->m_index).
      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
      .member) {
    do {
      if (*(long *)((long)&((it.node)->
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                           ).
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                           .
                           super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                           .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                   + 0x28) != peer) break;
      _Var2._M_head_impl = (uint256 *)((long)it.node + 0x68);
      local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
      super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
      super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl =
           (_Head_base<2UL,_const_uint256_&,_false>)
           (_Head_base<2UL,_const_uint256_&,_false>)_Var2._M_head_impl;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_50);
      _Var4._M_head_impl =
           (uint256 *)
           local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
           super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
           super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl;
      if (local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
          super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
          super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl != (uint256 *)0x0) {
        _Var4._M_head_impl =
             (uint256 *)
             ((long)local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
                    super__Tuple_impl<1UL,_bool,_const_uint256_&>.
                    super__Tuple_impl<2UL,_const_uint256_&>.
                    super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl + -0x68);
      }
      if ((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           *)_Var4._M_head_impl ==
          (this->m_index).
          super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
          .member) {
LAB_003f6ab5:
        poVar6 = (this->m_index).
                 super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                 .member;
      }
      else {
        local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
        super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
        super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl =
             (_Head_base<2UL,_const_uint256_&,_false>)
             (_Head_base<2UL,_const_uint256_&,_false>)_Var2._M_head_impl;
        boost::multi_index::detail::
        ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
        ::increment((pointer *)&local_50);
        puVar5 = (undefined1 *)
                 ((long)local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
                        super__Tuple_impl<1UL,_bool,_const_uint256_&>.
                        super__Tuple_impl<2UL,_const_uint256_&>.
                        super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl + -0x68);
        if (local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
            super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
            super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl == (uint256 *)0x0) {
          puVar5 = (undefined1 *)0x0;
        }
        if (*(long *)(puVar5 + 0x28) != peer) goto LAB_003f6ab5;
        local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
        super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
        super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl =
             (_Head_base<2UL,_const_uint256_&,_false>)
             (_Head_base<2UL,_const_uint256_&,_false>)_Var2._M_head_impl;
        boost::multi_index::detail::
        ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
        ::increment((pointer *)&local_50);
        poVar6 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                  *)((long)local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
                           super__Tuple_impl<1UL,_bool,_const_uint256_&>.
                           super__Tuple_impl<2UL,_const_uint256_&>.
                           super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl + -0x68);
        if (local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
            super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
            super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl == (uint256 *)0x0) {
          poVar6 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                    *)0x0;
        }
      }
      bVar3 = MakeCompleted(this,(Iter<ByTxHash>)it.node);
      if (bVar3) {
        __key = (key_type_conflict *)
                (((it.node)->
                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                 ).
                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                 .
                 super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                 .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf + 0x28
                );
        __position.
        super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>.
        _M_cur = (_Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                 )std::
                  _Hashtable<long,_std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_find_node(&(this->m_peerinfo)._M_h,
                                 *(ulong *)((long)&((it.node)->
                                                                                                      
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  .
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x28) %
                                 (this->m_peerinfo)._M_h._M_bucket_count,__key,(__hash_code)__key);
        *(undefined8 *)
         ((long)__position.
                super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                ._M_cur + 0x18) =
             *(undefined8 *)
              ((long)__position.
                     super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                     ._M_cur + 0x18);
        *(long *)((long)__position.
                        super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                        ._M_cur + 0x20) =
             *(long *)((long)__position.
                             super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                             ._M_cur + 0x20) -
             (ulong)((*(ulong *)((long)&((it.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                        ).
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        .
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000);
        plVar1 = (long *)((long)__position.
                                super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                                ._M_cur + 0x10);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          std::
          unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
          ::erase(&this->m_peerinfo,__position);
        }
        local_50.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
        super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
        super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl =
             (_Head_base<2UL,_const_uint256_&,_false>)
             (_Head_base<2UL,_const_uint256_&,_false>)_Var2._M_head_impl;
        boost::multi_index::detail::
        ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
        ::increment((pointer *)&local_50);
        boost::multi_index::
        multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
        ::erase_(&this->m_index,it.node);
      }
      it.node = poVar6;
    } while (poVar6 != (this->m_index).
                       super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .member);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DisconnectedPeer(NodeId peer)
    {
        auto& index = m_index.get<ByPeer>();
        auto it = index.lower_bound(ByPeerView{peer, false, uint256::ZERO});
        while (it != index.end() && it->m_peer == peer) {
            // Check what to continue with after this iteration. 'it' will be deleted in what follows, so we need to
            // decide what to continue with afterwards. There are a number of cases to consider:
            // - std::next(it) is end() or belongs to a different peer. In that case, this is the last iteration
            //   of the loop (denote this by setting it_next to end()).
            // - 'it' is not the only non-COMPLETED announcement for its txhash. This means it will be deleted, but
            //   no other Announcement objects will be modified. Continue with std::next(it) if it belongs to the
            //   same peer, but decide this ahead of time (as 'it' may change position in what follows).
            // - 'it' is the only non-COMPLETED announcement for its txhash. This means it will be deleted along
            //   with all other announcements for the same txhash - which may include std::next(it). However, other
            //   than 'it', no announcements for the same peer can be affected (due to (peer, txhash) uniqueness).
            //   In other words, the situation where std::next(it) is deleted can only occur if std::next(it)
            //   belongs to a different peer but the same txhash as 'it'. This is covered by the first bulletpoint
            //   already, and we'll have set it_next to end().
            auto it_next = (std::next(it) == index.end() || std::next(it)->m_peer != peer) ? index.end() :
                std::next(it);
            // If the announcement isn't already COMPLETED, first make it COMPLETED (which will mark other
            // CANDIDATEs as CANDIDATE_BEST, or delete all of a txhash's announcements if no non-COMPLETED ones are
            // left).
            if (MakeCompleted(m_index.project<ByTxHash>(it))) {
                // Then actually delete the announcement (unless it was already deleted by MakeCompleted).
                Erase<ByPeer>(it);
            }
            it = it_next;
        }
    }